

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssutil.cpp
# Opt level: O1

void qDrawRoundedCorners(QPainter *p,qreal x1,qreal y1,qreal x2,qreal y2,QSizeF *r1,QSizeF *r2,
                        Edge edge,BorderStyle s,QBrush c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  int iVar7;
  Edge edge_00;
  BorderStyle s_00;
  DataPtr DVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  QColor QVar11;
  QColor color;
  QPen pen;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  QBrush local_b0;
  undefined1 local_a8 [8];
  QBrush local_a0;
  undefined1 local_98 [8];
  QBrush local_90;
  undefined1 local_88 [8];
  QBrush local_80;
  undefined1 local_78 [8];
  QBrush local_70;
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((edge & ~BottomEdge) == TopEdge) {
    dVar9 = y2 - y1;
  }
  else {
    dVar9 = x2 - x1;
  }
  if (s == BorderStyle_Double) {
    if (edge < NumEdges) {
      dVar9 = dVar9 / 3.0;
      switch(edge) {
      default:
        QBrush::QBrush((QBrush *)local_40,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,y1,x2,dVar9 + y1,r1,r2,edge,BorderStyle_Solid,(QBrush)local_40);
        QBrush::~QBrush((QBrush *)local_40);
        dVar10 = y2 - dVar9;
        DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_48;
        QBrush::QBrush((QBrush *)
                       DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        break;
      case RightEdge:
        dVar10 = y1 + 1.0;
        QBrush::QBrush((QBrush *)local_60,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,dVar10,dVar9 + x1,y2,r1,r2,RightEdge,BorderStyle_Solid,
                            (QBrush)local_60);
        QBrush::~QBrush((QBrush *)local_60);
        x1 = x2 - dVar9;
        DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_68;
        QBrush::QBrush((QBrush *)
                       DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge = RightEdge;
        break;
      case LeftEdge:
        dVar10 = y1 + 1.0;
        QBrush::QBrush((QBrush *)local_50,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,dVar10,dVar9 + x1,y2,r1,r2,LeftEdge,BorderStyle_Solid,
                            (QBrush)local_50);
        QBrush::~QBrush((QBrush *)local_50);
        x1 = x2 - dVar9;
        DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_58;
        QBrush::QBrush((QBrush *)
                       DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge = LeftEdge;
      }
      qDrawRoundedCorners(p,x1,dVar10,x2,y2,r1,r2,edge,BorderStyle_Solid,
                          (QBrush)DVar8._M_t.
                                  super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      QBrush::~QBrush((QBrush *)
                      DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
    }
    goto LAB_005e217a;
  }
  if ((s & ~BorderStyle_None) == BorderStyle_Groove) {
    if (edge < NumEdges) {
      iVar7 = (int)((double)((ulong)(dVar9 * 0.5) & 0x8000000000000000 | (ulong)DAT_00684780) +
                   dVar9 * 0.5);
      s_00 = s == BorderStyle_Groove ^ BorderStyle_Outset;
      dVar10 = y1;
      qVar4 = y2;
      qVar5 = x1;
      qVar6 = x2;
      switch(edge) {
      case TopEdge:
        dVar10 = (double)iVar7 + y1;
        QBrush::QBrush(&local_70,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,y1,x2,dVar10,r1,r2,TopEdge,s_00,(QBrush)&local_70);
        QBrush::~QBrush(&local_70);
        DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_78;
        QBrush::QBrush((QBrush *)
                       DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge_00 = TopEdge;
        break;
      case RightEdge:
        QBrush::QBrush(&local_a0,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,(double)iVar7 + x1,y1,x2,y2,r1,r2,RightEdge,s_00,(QBrush)&local_a0);
        QBrush::~QBrush(&local_a0);
        DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_a8;
        QBrush::QBrush((QBrush *)
                       DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge_00 = RightEdge;
        qVar6 = x2 - (double)iVar7;
        break;
      case BottomEdge:
        QBrush::QBrush(&local_80,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,(double)iVar7 + y1,x2,y2,r1,r2,BottomEdge,s_00,(QBrush)&local_80);
        QBrush::~QBrush(&local_80);
        DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_88;
        QBrush::QBrush((QBrush *)
                       DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge_00 = BottomEdge;
        qVar4 = y2 - (double)iVar7;
        break;
      case LeftEdge:
        QBrush::QBrush(&local_90,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,y1,(double)iVar7 + x1,y2,r1,r2,LeftEdge,s_00,(QBrush)&local_90);
        QBrush::~QBrush(&local_90);
        DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_98;
        QBrush::QBrush((QBrush *)
                       DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge_00 = LeftEdge;
        qVar5 = (double)iVar7 + x1;
      }
      qDrawRoundedCorners(p,qVar5,dVar10,qVar6,qVar4,r1,r2,edge_00,
                          (s == BorderStyle_Groove) + BorderStyle_Inset,
                          (QBrush)DVar8._M_t.
                                  super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      QBrush::~QBrush((QBrush *)
                      DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
    }
  }
  else if (s == BorderStyle_Inset) {
    if (edge - RightEdge < 2) goto LAB_005e1a8b;
  }
  else if ((s == BorderStyle_Outset) && ((edge == TopEdge || (edge == LeftEdge)))) {
LAB_005e1a8b:
    QVar11 = QColor::lighter((QColor *)
                             (*(long *)c.d._M_t.
                                       super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>
                                       .super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 8)
                             ,0x96);
    color._8_8_ = QVar11._8_8_ & 0xffffffffffff;
    color._0_8_ = QVar11._0_8_;
    QBrush::operator=((QBrush *)
                      c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,color);
  }
  QPainter::save(p);
  QPainter::setBrush(p,NoBrush);
  local_b0.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  qPenFromStyle(&local_b0,dVar9,
                (BorderStyle)
                c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
  QPen::setCapStyle((QPen *)&local_b0,SquareCap);
  QPainter::setPen(p,(QPen *)&local_b0);
  if (edge < NumEdges) {
    dVar10 = dVar9 * 0.5;
    switch(edge) {
    case TopEdge:
      dVar3 = r1->wd;
      dVar1 = r1->ht;
      if ((0.0 < dVar3) && (0.0 < dVar1)) {
        local_d8._8_4_ = SUB84(y1 + dVar10,0);
        local_d8._0_8_ = (x1 - dVar3) + dVar10;
        local_d8._12_4_ = (int)((ulong)(y1 + dVar10) >> 0x20);
        dVar1 = (dVar1 + dVar1) - dVar9;
        local_c8._8_4_ = SUB84(dVar1,0);
        local_c8._0_8_ = (dVar3 + dVar3) - dVar9;
        local_c8._12_4_ = (int)((ulong)dVar1 >> 0x20);
        QPainter::drawArc(p,(QRectF *)local_d8,0x870,-0x2d0);
      }
      dVar3 = r2->wd;
      dVar1 = r2->ht;
      if ((0.0 < dVar3) && (0.0 < dVar1)) {
        local_d8._8_8_ = y1 + dVar10;
        local_d8._0_8_ = (x2 - dVar3) + dVar10;
        dVar10 = (dVar1 + dVar1) - dVar9;
        local_c8._8_4_ = SUB84(dVar10,0);
        local_c8._0_8_ = (dVar3 + dVar3) - dVar9;
        local_c8._12_4_ = (int)((ulong)dVar10 >> 0x20);
        iVar7 = 0x2d0;
LAB_005e215b:
        QPainter::drawArc(p,(QRectF *)local_d8,iVar7,0x2d0);
      }
      break;
    case RightEdge:
      dVar3 = r1->wd;
      dVar1 = r1->ht;
      if ((0.0 < dVar3) && (0.0 < dVar1)) {
        local_d8._8_8_ = dVar10 + (y1 - dVar1);
        local_d8._0_8_ = dVar10 + (x2 - (dVar3 + dVar3));
        dVar1 = (dVar1 + dVar1) - dVar9;
        local_c8._8_4_ = SUB84(dVar1,0);
        local_c8._0_8_ = (dVar3 + dVar3) - dVar9;
        local_c8._12_4_ = (int)((ulong)dVar1 >> 0x20);
        QPainter::drawArc(p,(QRectF *)local_d8,0x2d0,-0x2d0);
      }
      dVar3 = r2->wd;
      dVar1 = r2->ht;
      if ((0.0 < dVar3) && (0.0 < dVar1)) {
        local_d8._8_8_ = dVar10 + (y2 - dVar1);
        local_d8._0_8_ = dVar10 + (x2 - (dVar3 + dVar3));
        dVar10 = (dVar1 + dVar1) - dVar9;
        local_c8._8_4_ = SUB84(dVar10,0);
        local_c8._0_8_ = (dVar3 + dVar3) - dVar9;
        local_c8._12_4_ = (int)((ulong)dVar10 >> 0x20);
        iVar7 = 0x13b0;
        goto LAB_005e215b;
      }
      break;
    case BottomEdge:
      dVar3 = r1->wd;
      dVar1 = r1->ht;
      if ((0.0 < dVar3) && (0.0 < dVar1)) {
        local_d8._8_8_ = dVar10 + (y2 - (dVar1 + dVar1));
        local_d8._0_8_ = dVar10 + (x1 - dVar3);
        dVar1 = (dVar1 + dVar1) - dVar9;
        local_c8._8_4_ = SUB84(dVar1,0);
        local_c8._0_8_ = (dVar3 + dVar3) - dVar9;
        local_c8._12_4_ = (int)((ulong)dVar1 >> 0x20);
        QPainter::drawArc(p,(QRectF *)local_d8,-0x5a0,-0x2d0);
      }
      dVar3 = r2->wd;
      dVar1 = r2->ht;
      if ((0.0 < dVar3) && (0.0 < dVar1)) {
        local_d8._8_8_ = dVar10 + (y2 - (dVar1 + dVar1));
        local_d8._0_8_ = dVar10 + (x2 - dVar3);
        dVar10 = (dVar1 + dVar1) - dVar9;
        local_c8._8_4_ = SUB84(dVar10,0);
        local_c8._0_8_ = (dVar3 + dVar3) - dVar9;
        local_c8._12_4_ = (int)((ulong)dVar10 >> 0x20);
        iVar7 = -0x5a0;
        goto LAB_005e215b;
      }
      break;
    case LeftEdge:
      dVar3 = r1->wd;
      dVar1 = r1->ht;
      if ((0.0 < dVar3) && (0.0 < dVar1)) {
        dVar2 = (y1 - dVar1) + dVar10;
        local_d8._8_4_ = SUB84(dVar2,0);
        local_d8._0_8_ = x1 + dVar10;
        local_d8._12_4_ = (int)((ulong)dVar2 >> 0x20);
        dVar1 = (dVar1 + dVar1) - dVar9;
        local_c8._8_4_ = SUB84(dVar1,0);
        local_c8._0_8_ = (dVar3 + dVar3) - dVar9;
        local_c8._12_4_ = (int)((ulong)dVar1 >> 0x20);
        QPainter::drawArc(p,(QRectF *)local_d8,0x870,0x2d0);
      }
      dVar3 = r2->wd;
      dVar1 = r2->ht;
      if ((0.0 < dVar3) && (0.0 < dVar1)) {
        local_d8._8_8_ = (y2 - dVar1) + dVar10;
        local_d8._0_8_ = x1 + dVar10;
        dVar10 = (dVar1 + dVar1) - dVar9;
        local_c8._8_4_ = SUB84(dVar10,0);
        local_c8._0_8_ = (dVar3 + dVar3) - dVar9;
        local_c8._12_4_ = (int)((ulong)dVar10 >> 0x20);
        iVar7 = 0xb40;
        goto LAB_005e215b;
      }
    }
  }
  QPainter::restore(p);
  QPen::~QPen((QPen *)&local_b0);
LAB_005e217a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qDrawRoundedCorners(QPainter *p, qreal x1, qreal y1, qreal x2, qreal y2,
                         const QSizeF& r1, const QSizeF& r2,
                         Edge edge, BorderStyle s, QBrush c)
{
    const qreal pw = (edge == TopEdge || edge == BottomEdge) ? y2-y1 : x2-x1;
    if (s == BorderStyle_Double) {
        qreal wby3 = pw/3;
        switch (edge) {
        case TopEdge:
        case BottomEdge:
            qDrawRoundedCorners(p, x1, y1, x2, y1+wby3, r1, r2, edge, BorderStyle_Solid, c);
            qDrawRoundedCorners(p, x1, y2-wby3, x2, y2, r1, r2, edge, BorderStyle_Solid, c);
            break;
        case LeftEdge:
            qDrawRoundedCorners(p, x1, y1+1, x1+wby3, y2, r1, r2, LeftEdge, BorderStyle_Solid, c);
            qDrawRoundedCorners(p, x2-wby3, y1+1, x2, y2, r1, r2, LeftEdge, BorderStyle_Solid, c);
            break;
        case RightEdge:
            qDrawRoundedCorners(p, x1, y1+1, x1+wby3, y2, r1, r2, RightEdge, BorderStyle_Solid, c);
            qDrawRoundedCorners(p, x2-wby3, y1+1, x2, y2, r1, r2, RightEdge, BorderStyle_Solid, c);
            break;
        default:
            break;
        }
        return;
    } else if (s == BorderStyle_Ridge || s == BorderStyle_Groove) {
        BorderStyle s1, s2;
        if (s == BorderStyle_Groove) {
            s1 = BorderStyle_Inset;
            s2 = BorderStyle_Outset;
        } else {
            s1 = BorderStyle_Outset;
            s2 = BorderStyle_Inset;
        }
        int pwby2 = qRound(pw/2);
        switch (edge) {
        case TopEdge:
            qDrawRoundedCorners(p, x1, y1, x2, y1 + pwby2, r1, r2, TopEdge, s1, c);
            qDrawRoundedCorners(p, x1, y1 + pwby2, x2, y2, r1, r2, TopEdge, s2, c);
            break;
        case BottomEdge:
            qDrawRoundedCorners(p, x1, y1 + pwby2, x2, y2, r1, r2, BottomEdge, s1, c);
            qDrawRoundedCorners(p, x1, y1, x2, y2-pwby2, r1, r2, BottomEdge, s2, c);
            break;
        case LeftEdge:
            qDrawRoundedCorners(p, x1, y1, x1 + pwby2, y2, r1, r2, LeftEdge, s1, c);
            qDrawRoundedCorners(p, x1 + pwby2, y1, x2, y2, r1, r2, LeftEdge, s2, c);
            break;
        case RightEdge:
            qDrawRoundedCorners(p, x1 + pwby2, y1, x2, y2, r1, r2, RightEdge, s1, c);
            qDrawRoundedCorners(p, x1, y1, x2 - pwby2, y2, r1, r2, RightEdge, s2, c);
            break;
        default:
            break;
        }
    } else if ((s == BorderStyle_Outset && (edge == TopEdge || edge == LeftEdge))
            || (s == BorderStyle_Inset && (edge == BottomEdge || edge == RightEdge)))
            c = c.color().lighter();

    p->save();
    qreal pwby2 = pw/2;
    p->setBrush(Qt::NoBrush);
    QPen pen = qPenFromStyle(c, pw, s);
    pen.setCapStyle(Qt::SquareCap); // this eliminates the offby1 errors that we might hit below
    p->setPen(pen);
    switch (edge) {
    case TopEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x1 - r1.width() + pwby2, y1 + pwby2,
                              2*r1.width() - pw, 2*r1.height() - pw), 135*16, -45*16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x2 - r2.width() + pwby2, y1 + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), 45*16, 45*16);
        break;
    case BottomEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x1 - r1.width() + pwby2, y2 - 2*r1.height() + pwby2,
                              2*r1.width() - pw, 2*r1.height() - pw), -90 * 16, -45 * 16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x2 - r2.width() + pwby2, y2 - 2*r2.height() + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), -90 * 16, 45 * 16);
        break;
    case LeftEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x1 + pwby2, y1 - r1.height() + pwby2,
                       2*r1.width() - pw, 2*r1.height() - pw), 135*16, 45*16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x1 + pwby2, y2 - r2.height() + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), 180*16, 45*16);
        break;
    case RightEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x2 - 2*r1.width() + pwby2, y1 - r1.height() + pwby2,
                       2*r1.width() - pw, 2*r1.height() - pw), 45*16, -45*16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x2 - 2*r2.width() + pwby2, y2 - r2.height() + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), 315*16, 45*16);
        break;
    default:
        break;
    }
    p->restore();
}